

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphValidator.cpp
# Opt level: O0

bool __thiscall
dg::pta::LLVMPointerGraphValidator::reportInvalOperands
          (LLVMPointerGraphValidator *this,PSNode *nd,string *user_err)

{
  bool bVar1;
  byte bVar2;
  PSNodeType PVar3;
  Value *this_00;
  PointerSubgraph *pPVar4;
  PSNode *in_RSI;
  PSNode *in_RDI;
  Value *val;
  bool local_1;
  
  PVar3 = PSNode::getType(in_RSI);
  if (PVar3 == PHI) {
    this_00 = getValue((PSNode *)0x1b09fa);
    llvm::Value::getType(this_00);
    bVar1 = llvm::Type::isPointerTy((Type *)0x1b0a11);
    if (bVar1) {
      bVar1 = llvm::isa<llvm::Argument,llvm::Value_const*>((Value **)0x1b0a21);
      if ((bVar1) && (pPVar4 = PSNode::getParent(in_RSI), pPVar4 != (PointerSubgraph *)0x0)) {
        pPVar4 = PSNode::getParent(in_RSI);
        pPVar4 = PSNode::getParent(pPVar4->root);
        if (pPVar4 == (PointerSubgraph *)0x0) {
          return false;
        }
      }
      bVar2 = dg::pta::PointerGraphValidator::reportInvalOperands(in_RDI,(string *)in_RSI);
      local_1 = (bool)(bVar2 & 1);
    }
    else {
      local_1 = false;
    }
  }
  else {
    bVar2 = dg::pta::PointerGraphValidator::reportInvalOperands(in_RDI,(string *)in_RSI);
    local_1 = (bool)(bVar2 & 1);
  }
  return local_1;
}

Assistant:

bool LLVMPointerGraphValidator::reportInvalOperands(
        const PSNode *nd, const std::string &user_err) {
    // just check whether the PHI is a pointer type. If it is a number,
    // we do not know whether it is an error.
    if (nd->getType() == PSNodeType::PHI) {
        const llvm::Value *val = getValue(nd);
        assert(val);

        if (val->getType()->isPointerTy()) {
            // this is the PHI node that corresponds to argv, we're fine here
            if (isa<llvm::Argument>(val) && nd->getParent() &&
                nd->getParent()->root->getParent() == nullptr)
                return false;

            return PointerGraphValidator::reportInvalOperands(nd, user_err);
        } // else issue a warning?
        return false;
    }

    return PointerGraphValidator::reportInvalOperands(nd, user_err);
}